

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

bool __thiscall FIX::SocketMonitor::drop(SocketMonitor *this,socket_handle s)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  socket_handle local_3c;
  Sockets *local_38;
  
  local_38 = &this->m_readSockets;
  local_3c = s;
  iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&local_38->_M_t,&local_3c);
  iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_writeSockets)._M_t,&local_3c);
  iVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_connectSockets)._M_t,&local_3c);
  bVar1 = &(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header !=
          (_Rb_tree_header *)iVar6._M_node;
  bVar2 = &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header !=
          (_Rb_tree_header *)iVar5._M_node;
  bVar3 = &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header !=
          (_Rb_tree_header *)iVar4._M_node;
  if (bVar1 || (bVar2 || bVar3)) {
    socket_close(local_3c);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&local_38->_M_t,&local_3c);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(this->m_writeSockets)._M_t,&local_3c);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(this->m_connectSockets)._M_t,&local_3c);
    std::deque<int,_std::allocator<int>_>::push_back(&(this->m_dropped).c,&local_3c);
  }
  return bVar1 || (bVar2 || bVar3);
}

Assistant:

bool SocketMonitor::drop(socket_handle s) {
  Sockets::iterator i = m_readSockets.find(s);
  Sockets::iterator j = m_writeSockets.find(s);
  Sockets::iterator k = m_connectSockets.find(s);

  if (i != m_readSockets.end() || j != m_writeSockets.end() || k != m_connectSockets.end()) {
    socket_close(s);
    m_readSockets.erase(s);
    m_writeSockets.erase(s);
    m_connectSockets.erase(s);
    m_dropped.push(s);
    return true;
  }
  return false;
}